

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void __thiscall capnp::_::TestExtendsImpl::foo(TestExtendsImpl *this)

{
  long *in_RSI;
  
  foo(this,(CallContextHook *)((long)in_RSI + *(long *)(*in_RSI + -0x28)));
  return;
}

Assistant:

kj::Promise<void> TestExtendsImpl::foo(FooContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  EXPECT_EQ(321, params.getI());
  EXPECT_FALSE(params.getJ());
  result.setX("bar");
  return kj::READY_NOW;
}